

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_muli_i64_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  _Bool _Var1;
  int iVar2;
  TCGv_i64 arg2_00;
  TCGv_i64 t0;
  int64_t arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  if (arg2 == 0) {
    tcg_gen_movi_i64_m68k(tcg_ctx,ret,0);
  }
  else {
    _Var1 = is_power_of_2(arg2);
    if (_Var1) {
      iVar2 = ctz64(arg2);
      tcg_gen_shli_i64_m68k(tcg_ctx,ret,arg1,(long)iVar2);
    }
    else {
      arg2_00 = tcg_const_i64_m68k(tcg_ctx,arg2);
      tcg_gen_mul_i64_m68k(tcg_ctx,ret,arg1,arg2_00);
      tcg_temp_free_i64(tcg_ctx,arg2_00);
    }
  }
  return;
}

Assistant:

void tcg_gen_muli_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
    if (arg2 == 0) {
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
    } else if (is_power_of_2(arg2)) {
        tcg_gen_shli_i64(tcg_ctx, ret, arg1, ctz64(arg2));
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_mul_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}